

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QStyleOptionGraphicsItem>::resize_internal
          (QList<QStyleOptionGraphicsItem> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QStyleOptionGraphicsItem> *this_00;
  __off_t __length;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_RSI;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_RDI;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QStyleOptionGraphicsItem> *this_01;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QStyleOptionGraphicsItem> *__file;
  
  QArrayDataPointer<QStyleOptionGraphicsItem>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QStyleOptionGraphicsItem>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QStyleOptionGraphicsItem> *)
         capacity((QList<QStyleOptionGraphicsItem> *)0xa47211);
    qVar2 = QArrayDataPointer<QStyleOptionGraphicsItem>::freeSpaceAtBegin(in_stack_ffffffffffffffd8)
    ;
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QStyleOptionGraphicsItem> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QStyleOptionGraphicsItem> *)
                QArrayDataPointer<QStyleOptionGraphicsItem>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QStyleOptionGraphicsItem>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QStyleOptionGraphicsItem>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QStyleOptionGraphicsItem **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}